

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

PCMSegment *
Storage::Encodings::AppleGCR::Macintosh::data
          (PCMSegment *__return_storage_ptr__,uint8_t sector,uint8_t *source)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint8_t *source_00;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  value_type_conflict3 *__val;
  
  source_00 = (uint8_t *)operator_new(0x2c6);
  uVar6 = 0;
  memset(source_00,0,0x2c6);
  source_00[0] = 0xd5;
  source_00[1] = 0xaa;
  source_00[2] = 0xad;
  source_00[3] = (anonymous_namespace)::six_and_two_mapping[sector & 0x3f];
  lVar5 = 7;
  uVar12 = 0;
  uVar9 = 0;
  do {
    uVar10 = (uVar9 >> 7) + uVar9 * 2;
    bVar3 = *source;
    uVar4 = (uVar9 >> 7) + uVar6 + (uint)bVar3;
    pbVar1 = source + 1;
    uVar7 = uVar12 + *pbVar1 + (uVar4 >> 8);
    if (lVar5 == 0x2bf) {
      source = source + 2;
      uVar13 = 0;
      uVar8 = uVar10;
    }
    else {
      pbVar2 = source + 2;
      uVar8 = (uVar7 >> 8) + uVar10 + (uint)*pbVar2;
      source = source + 3;
      uVar13 = (*pbVar2 ^ uVar7) & 0xff;
    }
    uVar10 = bVar3 ^ uVar10;
    uVar11 = *pbVar1 ^ uVar4;
    uVar9 = uVar8 & 0xff;
    uVar12 = uVar7 & 0xff;
    uVar6 = uVar4 & 0xff;
    source_00[lVar5 + -2] = (anonymous_namespace)::six_and_two_mapping[uVar10 & 0x3f];
    source_00[lVar5 + -1] = (anonymous_namespace)::six_and_two_mapping[uVar11 & 0x3f];
    source_00[lVar5] = (anonymous_namespace)::six_and_two_mapping[uVar13 & 0x3f];
    source_00[lVar5 + -3] =
         (anonymous_namespace)::six_and_two_mapping
         [uVar13 >> 6 | uVar11 >> 4 & 0xc | uVar10 >> 2 & 0x30];
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x2c3);
  source_00[0x2c0] = (anonymous_namespace)::six_and_two_mapping[uVar4 & 0x3f];
  source_00[0x2c1] = (anonymous_namespace)::six_and_two_mapping[uVar7 & 0x3f];
  source_00[0x2c2] = (anonymous_namespace)::six_and_two_mapping[uVar8 & 0x3f];
  source_00[0x2bf] =
       (anonymous_namespace)::six_and_two_mapping[uVar9 >> 6 | uVar7 >> 4 & 0xc | uVar4 >> 2 & 0x30]
  ;
  source_00[0x2c3] = 0xde;
  source_00[0x2c4] = 0xaa;
  source_00[0x2c5] = 0xeb;
  Disk::PCMSegment::PCMSegment(__return_storage_ptr__,0x1630,source_00);
  operator_delete(source_00,0x2c6);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::Macintosh::data(uint8_t sector, const uint8_t *source) {
	std::vector<uint8_t> output(710);
	int checksum[3] = {0, 0, 0};

	// Write prologue.
	output[0] = data_prologue[0];
	output[1] = data_prologue[1];
	output[2] = data_prologue[2];

	// Add the sector number.
	output[3] = six_and_two_mapping[sector & 0x3f];

	// The Macintosh has a similar checksum-as-it-goes approach to encoding
	// to the Apple II, but works entirely differently. Each three bytes of
	// input are individually encoded to four GCR bytes, their output values
	// being a (mutating) function of the current checksum.
	//
	// Address references below, such as 'Cf. 18FA4' are to addresses in the
	// Macintosh Plus ROM.
	for(size_t c = 0; c < 175; ++c) {
		uint8_t values[3];

		// The low byte of the checksum is rotated left one position; Cf. 18FA4.
		checksum[0] = (checksum[0] << 1) | (checksum[0] >> 7);

		// See 18FBA and 18FBC: an ADDX (with the carry left over from the roll)
		// and an EOR act to update the checksum and generate the next output.
		values[0] = uint8_t(*source ^ checksum[0]);
		checksum[2] += *source + (checksum[0] >> 8);
		++source;

		// As above, but now 18FD0 and 18FD2.
		values[1] = uint8_t(*source ^ checksum[2]);
		checksum[1] += *source + (checksum[2] >> 8);
		++source;

		// Avoid a potential read overrun, but otherwise continue as before.
		if(c == 174) {
			values[2] = 0;
		} else {
			values[2] = uint8_t(*source ^ checksum[1]);
			checksum[0] += *source + (checksum[1] >> 8);
			++source;
		}

		// Throw away the top bits of checksum[1] and checksum[2]; the original
		// routine is byte centric, the longer ints here are just to retain the
		// carry after each add transientliy.
		checksum[0] &= 0xff;
		checksum[1] &= 0xff;
		checksum[2] &= 0xff;

		// Having mutated those three bytes according to the current checksum,
		// and the checksum according to those bytes, run them through the
		// GCR conversion table.
		output[4 + c*4 + 1] = six_and_two_mapping[values[0] & 0x3f];
		output[4 + c*4 + 2] = six_and_two_mapping[values[1] & 0x3f];
		output[4 + c*4 + 3] = six_and_two_mapping[values[2] & 0x3f];
		output[4 + c*4 + 0] = six_and_two_mapping[
			((values[0] >> 2) & 0x30) |
			((values[1] >> 4) & 0x0c) |
			((values[2] >> 6) & 0x03)
		];
	}

	// Also write the checksum.
	//
	// Caveat: the first byte written here will overwrite the final byte that
	// was deposited in the loop above. That's deliberate. The final byte from
	// the loop above doesn't contain any useful content, and isn't actually
	// included on disk.
	output[704] = six_and_two_mapping[checksum[2] & 0x3f];
	output[705] = six_and_two_mapping[checksum[1] & 0x3f];
	output[706] = six_and_two_mapping[checksum[0] & 0x3f];
	output[703] = six_and_two_mapping[
		((checksum[2] >> 2) & 0x30) |
		((checksum[1] >> 4) & 0x0c) |
		((checksum[0] >> 6) & 0x03)
	];

	// Write epilogue.
	output[707] = epilogue[0];
	output[708] = epilogue[1];
	output[709] = epilogue[2];

	return Storage::Disk::PCMSegment(output);
}